

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::BuildReg4
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot src1RegSlot,
          RegSlot src2RegSlot,RegSlot src3RegSlot)

{
  uint uVar1;
  uint uVar2;
  Func *func;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  RegOpnd *pRVar8;
  RegOpnd *pRVar9;
  RegOpnd *pRVar10;
  RegOpnd *pRVar11;
  Instr *pIVar12;
  Opnd *this_00;
  RegOpnd *src1Opnd;
  ByteCodeUsesInstr *this_01;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  IntConstOpnd *pIVar13;
  IndirOpnd *pIVar14;
  StackSym *pSVar15;
  RegOpnd *dstOpnd;
  int iVar16;
  undefined6 in_register_00000032;
  
  iVar16 = (int)CONCAT62(in_register_00000032,newOpcode);
  if ((iVar16 != 0xfc) && (iVar16 != 0x184)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x982,
                       "(newOpcode == Js::OpCode::Concat3 || newOpcode == Js::OpCode::Restify)",
                       "newOpcode == Js::OpCode::Concat3 || newOpcode == Js::OpCode::Restify");
    if (!bVar4) goto LAB_004cc0f0;
    *puVar6 = 0;
  }
  pRVar7 = BuildSrcOpnd(this,src1RegSlot,TyVar);
  pRVar8 = BuildSrcOpnd(this,src2RegSlot,TyVar);
  pRVar9 = BuildSrcOpnd(this,src3RegSlot,TyVar);
  if (newOpcode == Restify) {
    pRVar10 = BuildSrcOpnd(this,dstRegSlot,TyVar);
    pRVar11 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar12 = IR::Instr::New(ExtendArg_A,&pRVar11->super_Opnd,&pRVar9->super_Opnd,this->m_func);
    AddInstr(this,pIVar12,offset);
    pRVar9 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar12 = IR::Instr::New(ExtendArg_A,&pRVar9->super_Opnd,&pRVar8->super_Opnd,pIVar12->m_dst,
                             this->m_func);
    AddInstr(this,pIVar12,0xffffffff);
    pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar12 = IR::Instr::New(ExtendArg_A,&pRVar8->super_Opnd,&pRVar7->super_Opnd,pIVar12->m_dst,
                             this->m_func);
    AddInstr(this,pIVar12,0xffffffff);
    pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar12 = IR::Instr::New(ExtendArg_A,&pRVar7->super_Opnd,&pRVar10->super_Opnd,pIVar12->m_dst,
                             this->m_func);
    AddInstr(this,pIVar12,0xffffffff);
    this_00 = pIVar12->m_dst;
    pIVar12 = IR::Instr::New(Restify,this->m_func);
    if (pIVar12->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_004cc0f0;
      *puVar6 = 0;
    }
    func = pIVar12->m_func;
    if (this_00->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) {
LAB_004cc0f0:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    bVar5 = this_00->field_0xb;
    if ((bVar5 & 2) != 0) {
      this_00 = IR::Opnd::Copy(this_00,func);
      bVar5 = this_00->field_0xb;
    }
    this_00->field_0xb = bVar5 | 2;
    pIVar12->m_src1 = this_00;
  }
  else {
    pRVar10 = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
    pRVar11 = InsertConvPrimStr(this,pRVar7,offset,true);
    src1Opnd = InsertConvPrimStr(this,pRVar8,0xffffffff,true);
    pRVar9 = InsertConvPrimStr(this,pRVar9,0xffffffff,true);
    uVar1 = *(uint *)&pRVar7->m_sym->field_0x18;
    uVar2 = *(uint *)&pRVar8->m_sym->field_0x18;
    if (((uVar2 | uVar1) >> 0xd & 1) != 0) {
      this_01 = IR::ByteCodeUsesInstr::New(this->m_func,0xffffffff);
      if ((uVar1 >> 0xd & 1) != 0) {
        IR::ByteCodeUsesInstr::Set(this_01,&pRVar7->super_Opnd);
      }
      if ((uVar2 >> 0xd & 1) != 0) {
        IR::ByteCodeUsesInstr::Set(this_01,&pRVar8->super_Opnd);
      }
      AddInstr(this,&this_01->super_Instr,0xffffffff);
    }
    this_02 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_02);
    this_03 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,BackendConcatExprOptPhase,sourceContextId,functionId)
    ;
    if (bVar4) {
      pIVar13 = IR::IntConstOpnd::New(3,TyUint32,this->m_func,true);
      pIVar12 = IR::Instr::New(NewConcatStrMulti,&pRVar10->super_Opnd,&pIVar13->super_Opnd,
                               this->m_func);
      IR::Opnd::SetValueType(&pRVar10->super_Opnd,(ValueType)0x800);
      AddInstr(this,pIVar12,0xffffffff);
      pIVar14 = IR::IndirOpnd::New(pRVar10,0,TyVar,this->m_func,false);
      pIVar12 = IR::Instr::New(SetConcatStrMultiItem,&pIVar14->super_Opnd,&pRVar11->super_Opnd,
                               this->m_func);
      AddInstr(this,pIVar12,0xffffffff);
      pIVar14 = IR::IndirOpnd::New(pRVar10,1,TyVar,this->m_func,false);
      pIVar12 = IR::Instr::New(SetConcatStrMultiItem,&pIVar14->super_Opnd,&src1Opnd->super_Opnd,
                               this->m_func);
      AddInstr(this,pIVar12,0xffffffff);
      pIVar14 = IR::IndirOpnd::New(pRVar10,2,TyVar,this->m_func,false);
      pIVar12 = IR::Instr::New(SetConcatStrMultiItem,&pIVar14->super_Opnd,&pRVar9->super_Opnd,
                               this->m_func);
    }
    else {
      pSVar15 = StackSym::New(this->m_func);
      pRVar7 = IR::RegOpnd::New(pSVar15,TyVar,this->m_func);
      pSVar15 = StackSym::New(this->m_func);
      pRVar8 = IR::RegOpnd::New(pSVar15,TyVar,this->m_func);
      pSVar15 = StackSym::New(this->m_func);
      dstOpnd = IR::RegOpnd::New(pSVar15,TyVar,this->m_func);
      pIVar12 = IR::Instr::New(SetConcatStrMultiItemBE,&pRVar7->super_Opnd,&pRVar11->super_Opnd,
                               this->m_func);
      AddInstr(this,pIVar12,0xffffffff);
      pIVar12 = IR::Instr::New(SetConcatStrMultiItemBE,&pRVar8->super_Opnd,&src1Opnd->super_Opnd,
                               &pRVar7->super_Opnd,this->m_func);
      AddInstr(this,pIVar12,0xffffffff);
      pIVar12 = IR::Instr::New(SetConcatStrMultiItemBE,&dstOpnd->super_Opnd,&pRVar9->super_Opnd,
                               &pRVar8->super_Opnd,this->m_func);
      AddInstr(this,pIVar12,0xffffffff);
      pIVar13 = IR::IntConstOpnd::New(3,TyUint32,this->m_func,true);
      pIVar12 = IR::Instr::New(NewConcatStrMultiBE,&pRVar10->super_Opnd,&pIVar13->super_Opnd,
                               &dstOpnd->super_Opnd,this->m_func);
      IR::Opnd::SetValueType(&pRVar10->super_Opnd,(ValueType)0x800);
    }
  }
  AddInstr(this,pIVar12,0xffffffff);
  return;
}

Assistant:

void
IRBuilder::BuildReg4(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot,
                    Js::RegSlot src2RegSlot, Js::RegSlot src3RegSlot)
{
    IR::Instr *     instr = nullptr;
    Assert(newOpcode == Js::OpCode::Concat3 || newOpcode == Js::OpCode::Restify);

    IR::RegOpnd * src1Opnd = this->BuildSrcOpnd(src1RegSlot);
    IR::RegOpnd * src2Opnd = this->BuildSrcOpnd(src2RegSlot);
    IR::RegOpnd * src3Opnd = this->BuildSrcOpnd(src3RegSlot);    

    if (newOpcode == Js::OpCode::Restify)
    {
        IR::RegOpnd * src0Opnd = this->BuildSrcOpnd(dstRegSlot);
        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src3Opnd, m_func);
        this->AddInstr(instr, offset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src2Opnd, instr->GetDst(), m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, instr->GetDst(), m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src0Opnd, instr->GetDst(), m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        IR::Opnd *firstArg = instr->GetDst();
        instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(firstArg);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        return;
    }

    IR::RegOpnd * dstOpnd = this->BuildDstOpnd(dstRegSlot);

    IR::RegOpnd * str1Opnd = InsertConvPrimStr(src1Opnd, offset, true);
    IR::RegOpnd * str2Opnd = InsertConvPrimStr(src2Opnd, Js::Constants::NoByteCodeOffset, true);
    IR::RegOpnd * str3Opnd = InsertConvPrimStr(src3Opnd, Js::Constants::NoByteCodeOffset, true);

    // Need to insert a byte code use for src1/src2 that if ConvPrimStr of the src2/src3 bail out
    // we will restore it.
    bool src1HasByteCodeRegSlot = src1Opnd->m_sym->HasByteCodeRegSlot();
    bool src2HasByteCodeRegSlot = src2Opnd->m_sym->HasByteCodeRegSlot();
    if (src1HasByteCodeRegSlot || src2HasByteCodeRegSlot)
    {
        IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, Js::Constants::NoByteCodeOffset);
        if (src1HasByteCodeRegSlot)
        {
            byteCodeUse->Set(src1Opnd);
        }
        if (src2HasByteCodeRegSlot)
        {
            byteCodeUse->Set(src2Opnd);
        }
        this->AddInstr(byteCodeUse, Js::Constants::NoByteCodeOffset);
    }

    if (!PHASE_OFF(Js::BackendConcatExprOptPhase, this->m_func))
    {
        IR::RegOpnd* tmpDstOpnd1 = IR::RegOpnd::New(StackSym::New(this->m_func), TyVar, this->m_func);
        IR::RegOpnd* tmpDstOpnd2 = IR::RegOpnd::New(StackSym::New(this->m_func), TyVar, this->m_func);
        IR::RegOpnd* tmpDstOpnd3 = IR::RegOpnd::New(StackSym::New(this->m_func), TyVar, this->m_func);

        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItemBE, tmpDstOpnd1, str1Opnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItemBE, tmpDstOpnd2, str2Opnd, tmpDstOpnd1, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItemBE, tmpDstOpnd3, str3Opnd, tmpDstOpnd2, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        IR::IntConstOpnd * countIntConstOpnd = IR::IntConstOpnd::New(3, TyUint32, m_func, true);
        instr = IR::Instr::New(Js::OpCode::NewConcatStrMultiBE, dstOpnd, countIntConstOpnd, tmpDstOpnd3, m_func);
        dstOpnd->SetValueType(ValueType::String);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
    }
    else
    {
        instr = IR::Instr::New(Js::OpCode::NewConcatStrMulti, dstOpnd, IR::IntConstOpnd::New(3, TyUint32, m_func, true), m_func);
        dstOpnd->SetValueType(ValueType::String);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem, IR::IndirOpnd::New(dstOpnd, 0, TyVar, m_func), str1Opnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem, IR::IndirOpnd::New(dstOpnd, 1, TyVar, m_func), str2Opnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
        instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem, IR::IndirOpnd::New(dstOpnd, 2, TyVar, m_func), str3Opnd, m_func);
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
    }
}